

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void av1_setup_build_prediction_by_left_pred
               (MACROBLOCKD *xd,int rel_mi_row,uint8_t left_mi_height,MB_MODE_INFO *left_mbmi,
               build_prediction_ctxt *ctxt,int num_planes)

{
  BLOCK_SIZE BVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint8_t **ppuVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  uint8_t *puVar10;
  AV1_COMMON *pAVar11;
  ulong uVar12;
  int mi_row;
  RefCntBuffer *pRVar13;
  long lVar14;
  int iVar15;
  int *piVar16;
  ulong uVar17;
  scale_factors *sf;
  uint uVar18;
  
  BVar1 = left_mbmi->bsize;
  mi_row = xd->mi_row + rel_mi_row;
  left_mbmi->ref_frame[1] = -1;
  (left_mbmi->interinter_comp).type = '\0';
  if (0 < num_planes) {
    uVar12 = 3;
    if (BLOCK_8X8 < BVar1) {
      uVar12 = (ulong)BVar1;
    }
    ppuVar6 = ctxt->tmp_buf;
    piVar7 = ctxt->tmp_width;
    piVar8 = ctxt->tmp_height;
    piVar9 = ctxt->tmp_stride;
    piVar16 = &xd->plane[0].dst.stride;
    uVar17 = 0;
    do {
      puVar10 = ppuVar6[uVar17];
      iVar15 = piVar7[uVar17];
      uVar18 = (uint)((0x20005UL >> (uVar12 & 0x3f) & 1) != 0);
      if (piVar16[-8] == 0) {
        uVar18 = 0;
      }
      iVar4 = piVar8[uVar17];
      iVar5 = piVar9[uVar17];
      ((buf_2d *)(piVar16 + -6))->buf =
           puVar10 + (long)((int)((~uVar18 & rel_mi_row) << 2) >> ((byte)piVar16[-8] & 0x1f)) *
                     (long)iVar5;
      *(uint8_t **)(piVar16 + -4) = puVar10;
      piVar16[-2] = iVar15;
      piVar16[-1] = iVar4;
      *piVar16 = iVar5;
      uVar17 = uVar17 + 1;
      piVar16 = piVar16 + 0x28c;
    } while ((uint)num_planes != uVar17);
  }
  cVar2 = left_mbmi->ref_frame[1];
  lVar14 = 0;
  do {
    bVar3 = left_mbmi->ref_frame[lVar14];
    pAVar11 = ctxt->cm;
    iVar15 = -1;
    if ((byte)(bVar3 - 1) < 8) {
      iVar15 = pAVar11->remapped_ref_idx[bVar3 - 1];
    }
    if (iVar15 == -1) {
      pRVar13 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar13 = pAVar11->ref_frame_map[iVar15];
    }
    iVar15 = -1;
    if ((byte)(bVar3 - 1) < 8) {
      iVar15 = pAVar11->remapped_ref_idx[bVar3 - 1];
    }
    sf = (scale_factors *)0x0;
    if (iVar15 != -1) {
      sf = pAVar11->ref_scale_factors + iVar15;
    }
    xd->block_ref_scale_factors[lVar14] = sf;
    if ((sf->x_scale_fp == -1) || (sf->y_scale_fp == -1)) {
      aom_internal_error(xd->error_info,AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    }
    av1_setup_pre_planes(xd,(int)lVar14,&pRVar13->buf,mi_row,xd->mi_col,sf,num_planes);
  } while ((lVar14 == 0) && (lVar14 = 1, '\0' < cVar2));
  xd->mb_to_top_edge = mi_row * -0x20;
  xd->mb_to_bottom_edge =
       ((uint)xd->height - ((uint)left_mi_height + rel_mi_row)) * 0x20 + ctxt->mb_to_far_edge;
  return;
}

Assistant:

void av1_setup_build_prediction_by_left_pred(MACROBLOCKD *xd, int rel_mi_row,
                                             uint8_t left_mi_height,
                                             MB_MODE_INFO *left_mbmi,
                                             struct build_prediction_ctxt *ctxt,
                                             const int num_planes) {
  const BLOCK_SIZE l_bsize = AOMMAX(BLOCK_8X8, left_mbmi->bsize);
  const int left_mi_row = xd->mi_row + rel_mi_row;

  modify_neighbor_predictor_for_obmc(left_mbmi);

  for (int j = 0; j < num_planes; ++j) {
    struct macroblockd_plane *const pd = &xd->plane[j];
    setup_pred_plane(&pd->dst, l_bsize, ctxt->tmp_buf[j], ctxt->tmp_width[j],
                     ctxt->tmp_height[j], ctxt->tmp_stride[j], rel_mi_row, 0,
                     NULL, pd->subsampling_x, pd->subsampling_y);
  }

  const int num_refs = 1 + has_second_ref(left_mbmi);

  for (int ref = 0; ref < num_refs; ++ref) {
    const MV_REFERENCE_FRAME frame = left_mbmi->ref_frame[ref];

    const RefCntBuffer *const ref_buf = get_ref_frame_buf(ctxt->cm, frame);
    const struct scale_factors *const ref_scale_factors =
        get_ref_scale_factors_const(ctxt->cm, frame);

    xd->block_ref_scale_factors[ref] = ref_scale_factors;
    if ((!av1_is_valid_scale(ref_scale_factors)))
      aom_internal_error(xd->error_info, AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    av1_setup_pre_planes(xd, ref, &ref_buf->buf, left_mi_row, xd->mi_col,
                         ref_scale_factors, num_planes);
  }

  xd->mb_to_top_edge = GET_MV_SUBPEL(MI_SIZE * (-left_mi_row));
  xd->mb_to_bottom_edge =
      ctxt->mb_to_far_edge +
      GET_MV_SUBPEL((xd->height - rel_mi_row - left_mi_height) * MI_SIZE);
}